

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-lex.c
# Opt level: O0

int iswhite(int ch)

{
  undefined1 local_d;
  int ch_local;
  
  local_d = true;
  if ((((ch != 0) && (local_d = true, ch != 9)) && (local_d = true, ch != 10)) &&
     ((local_d = true, ch != 0xc && (local_d = true, ch != 0xd)))) {
    local_d = ch == 0x20;
  }
  return (int)local_d;
}

Assistant:

static inline int iswhite(int ch)
{
    return
            ch == '\000' ||
            ch == '\011' ||
            ch == '\012' ||
            ch == '\014' ||
            ch == '\015' ||
            ch == '\040';
}